

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O2

int fp_pack(undefined8 infits,undefined8 outfits,undefined8 param_3)

{
  fitsfile *pfVar1;
  fitsfile *pfVar2;
  long lVar3;
  int stat_00;
  undefined8 *puVar4;
  undefined8 *puVar5;
  byte bVar6;
  undefined4 uStack0000000000000008;
  undefined4 uStack000000000000000c;
  int iStack0000000000000010;
  undefined4 uStack0000000000000014;
  uint uStack0000000000000018;
  undefined4 uStack000000000000001c;
  undefined8 in_stack_00000020;
  undefined4 in_stack_00000028;
  undefined8 in_stack_00000078;
  undefined8 auStack_6f8 [214];
  int stat;
  fitsfile *outfptr;
  fitsfile *infptr;
  
  bVar6 = 0;
  stat = 0;
  ffopentest(10,&infptr,infits,0,&stat);
  if (stat != 0) {
    ffrprt(_stderr);
    exit(stat);
  }
  ffinit(&outfptr,outfits,&stat);
  if (stat == 0) {
    stat_00 = 0;
    while (stat_00 == 0) {
      fits_set_lossy_int(outfptr,in_stack_00000028,&stat);
      fits_set_compression_type(outfptr,uStack0000000000000008,&stat);
      fits_set_tile_dim(outfptr,6,&stack0x00000038,&stat);
      fits_set_quantize_method
                (outfptr,-(uint)(iStack0000000000000010 != 0) | uStack0000000000000018,&stat);
      fits_set_quantize_level(uStack000000000000000c,outfptr,&stat);
      fits_set_dither_offset(outfptr,uStack0000000000000014,&stat);
      fits_set_hcomp_scale(uStack000000000000001c,outfptr,&stat);
      fits_set_hcomp_smooth(outfptr,in_stack_00000020._4_4_,&stat);
      pfVar2 = infptr;
      pfVar1 = outfptr;
      puVar4 = (undefined8 *)&stack0x00000008;
      puVar5 = auStack_6f8;
      for (lVar3 = 0xd5; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
      }
      fp_pack_hdu(pfVar2,pfVar1,param_3,&stat);
      if (in_stack_00000078._4_4_ != 0) {
        ffpcks(outfptr,&stat);
      }
      ffmrhd(infptr,1,0,&stat);
      stat_00 = stat;
    }
    if (stat_00 == 0x6b) {
      stat = 0;
      stat_00 = 0;
    }
    if (in_stack_00000078._4_4_ != 0) {
      ffmahd(outfptr,1,0,&stat);
      ffpcks(outfptr,&stat);
      stat_00 = stat;
    }
    if (stat_00 == 0) {
      ffclos(outfptr,&stat);
      ffclos(infptr,&stat);
      return 0;
    }
    fp_abort_output(infptr,outfptr,stat_00);
  }
  fp_abort_output(infptr,(fitsfile *)0x0,stat);
}

Assistant:

int fp_pack (char *infits, char *outfits, fpstate fpvar, int *islossless)
{
	fitsfile *infptr, *outfptr;
	int	stat=0;

	fits_open_file (&infptr, infits, READONLY, &stat);
	if (stat) { fits_report_error (stderr, stat); exit (stat); }

	fits_create_file (&outfptr, outfits, &stat);
	if (stat) { 
	    fp_abort_output(infptr, NULL, stat);
	}


	if (stat) { 
	    fp_abort_output(infptr, outfptr, stat);
	}

	while (! stat) {

	    /*  LOOP OVER EACH HDU */

	    fits_set_lossy_int (outfptr, fpvar.int_to_float, &stat);
	    fits_set_compression_type (outfptr, fpvar.comptype, &stat);
	    fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);

	    if (fpvar.no_dither)
	        fits_set_quantize_method(outfptr, -1, &stat);
	    else
	        fits_set_quantize_method(outfptr, fpvar.dither_method, &stat);

	    fits_set_quantize_level (outfptr, fpvar.quantize_level, &stat);
	    fits_set_dither_offset(outfptr, fpvar.dither_offset, &stat);
	    fits_set_hcomp_scale (outfptr, fpvar.scale, &stat);
	    fits_set_hcomp_smooth (outfptr, fpvar.smooth, &stat);

	    fp_pack_hdu (infptr, outfptr, fpvar, islossless, &stat);

	    if (fpvar.do_checksums) {
	        fits_write_chksum (outfptr, &stat);
	    }

	    fits_movrel_hdu (infptr, 1, NULL, &stat);
	}

	if (stat == END_OF_FILE) stat = 0;

	/* set checksum for case of newly created primary HDU	 */

	if (fpvar.do_checksums) {
	    fits_movabs_hdu (outfptr, 1, NULL, &stat);
	    fits_write_chksum (outfptr, &stat);
	}

	if (stat) { 
	    fp_abort_output(infptr, outfptr, stat);
	}

	fits_close_file (outfptr, &stat);
	fits_close_file (infptr, &stat);

	return(0);
}